

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::getFramebufferDetails
          (GeometryShaderMaxOutputComponentsTest *this,GLenum *out_texture_format,
          GLenum *out_texture_read_format,GLenum *out_texture_read_type,GLuint *out_texture_width,
          GLuint *out_texture_height,uint *out_texture_pixel_size)

{
  *out_texture_format = 0x8235;
  *out_texture_read_format = 0x8d99;
  *out_texture_read_type = 0x1404;
  *out_texture_width = this->m_texture_width;
  *out_texture_height = 2;
  *out_texture_pixel_size = 0x10;
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsTest::getFramebufferDetails(
	glw::GLenum& out_texture_format, glw::GLenum& out_texture_read_format, glw::GLenum& out_texture_read_type,
	glw::GLuint& out_texture_width, glw::GLuint& out_texture_height, unsigned int& out_texture_pixel_size)
{
	out_texture_format		= GL_R32I;
	out_texture_read_format = GL_RGBA_INTEGER;
	out_texture_read_type   = GL_INT;
	out_texture_width		= m_texture_width;
	out_texture_height		= m_texture_height;
	out_texture_pixel_size  = 4 * 4;
}